

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

char * nifti_slice_string(int ss)

{
  char *pcStack_10;
  int ss_local;
  
  switch(ss) {
  case 1:
    pcStack_10 = "sequential_increasing";
    break;
  case 2:
    pcStack_10 = "sequential_decreasing";
    break;
  case 3:
    pcStack_10 = "alternating_increasing";
    break;
  case 4:
    pcStack_10 = "alternating_decreasing";
    break;
  case 5:
    pcStack_10 = "alternating_increasing_2";
    break;
  case 6:
    pcStack_10 = "alternating_decreasing_2";
    break;
  default:
    pcStack_10 = "Unknown";
  }
  return pcStack_10;
}

Assistant:

char const *nifti_slice_string( int ss )
{
   switch( ss ){
     case NIFTI_SLICE_SEQ_INC:  return "sequential_increasing"    ;
     case NIFTI_SLICE_SEQ_DEC:  return "sequential_decreasing"    ;
     case NIFTI_SLICE_ALT_INC:  return "alternating_increasing"   ;
     case NIFTI_SLICE_ALT_DEC:  return "alternating_decreasing"   ;
     case NIFTI_SLICE_ALT_INC2: return "alternating_increasing_2" ;
     case NIFTI_SLICE_ALT_DEC2: return "alternating_decreasing_2" ;
   }
   return "Unknown" ;
}